

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSparseMatrix.cpp
# Opt level: O3

void __thiscall
HighsSparseMatrix::productTransposeQuad
          (HighsSparseMatrix *this,vector<double,_std::allocator<double>_> *result,
          vector<double,_std::allocator<double>_> *row,HighsInt debug_report)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  pointer piVar4;
  pointer pdVar5;
  pointer pdVar6;
  pointer pdVar7;
  pointer piVar8;
  int iVar9;
  long lVar10;
  long lVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  vector<HighsCDouble,_std::allocator<HighsCDouble>_> value;
  allocator_type local_51;
  vector<HighsCDouble,_std::allocator<HighsCDouble>_> local_50;
  value_type local_38;
  
  local_50.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  std::vector<double,_std::allocator<double>_>::_M_fill_assign
            (result,(long)this->num_col_,(value_type_conflict1 *)&local_50);
  if (this->format_ == kColwise) {
    iVar1 = this->num_col_;
    if (0 < (long)iVar1) {
      piVar3 = (this->start_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      piVar4 = (this->index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar5 = (row->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      pdVar6 = (this->value_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar7 = (result->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      lVar11 = 0;
      iVar9 = *piVar3;
      do {
        iVar2 = piVar3[lVar11 + 1];
        dVar12 = 0.0;
        if (iVar9 < iVar2) {
          lVar10 = (long)iVar9;
          dVar13 = 0.0;
          do {
            dVar15 = pdVar5[piVar4[lVar10]] * pdVar6[lVar10];
            dVar14 = dVar13 + dVar15;
            dVar12 = dVar12 + (dVar13 - (dVar14 - dVar15)) + (dVar15 - (dVar14 - (dVar14 - dVar15)))
            ;
            lVar10 = lVar10 + 1;
            dVar13 = dVar14;
          } while (iVar2 != lVar10);
          dVar12 = dVar12 + dVar14;
        }
        pdVar7[lVar11] = dVar12;
        lVar11 = lVar11 + 1;
        iVar9 = iVar2;
      } while (lVar11 != iVar1);
    }
  }
  else {
    local_38.hi = 0.0;
    local_38.lo = 0.0;
    std::vector<HighsCDouble,_std::allocator<HighsCDouble>_>::vector
              (&local_50,(long)this->num_col_,&local_38,&local_51);
    iVar1 = this->num_row_;
    if (0 < (long)iVar1) {
      piVar4 = (this->start_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      piVar8 = (this->index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar5 = (row->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      pdVar6 = (this->value_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar11 = 0;
      iVar9 = *piVar4;
      do {
        iVar2 = piVar4[lVar11 + 1];
        if (iVar9 < iVar2) {
          lVar10 = (long)iVar9;
          do {
            dVar13 = pdVar5[lVar11] * pdVar6[lVar10];
            iVar9 = piVar8[lVar10];
            dVar12 = local_50.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>.
                     _M_impl.super__Vector_impl_data._M_start[iVar9].hi;
            dVar14 = dVar13 + dVar12;
            local_50.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
            super__Vector_impl_data._M_start[iVar9].hi = dVar14;
            local_50.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
            super__Vector_impl_data._M_start[iVar9].lo =
                 (dVar12 - (dVar14 - dVar13)) + (dVar13 - (dVar14 - (dVar14 - dVar13))) +
                 local_50.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
                 super__Vector_impl_data._M_start[iVar9].lo;
            lVar10 = lVar10 + 1;
          } while (iVar2 != lVar10);
        }
        lVar11 = lVar11 + 1;
        iVar9 = iVar2;
      } while (lVar11 != iVar1);
    }
    iVar1 = this->num_col_;
    if ((long)iVar1 < 1) {
      if (local_50.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
          super__Vector_impl_data._M_start == (pointer)0x0) {
        return;
      }
    }
    else {
      pdVar5 = (result->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      lVar11 = 0;
      do {
        *(double *)((long)pdVar5 + lVar11) =
             *(double *)
              ((long)&(local_50.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>.
                       _M_impl.super__Vector_impl_data._M_start)->hi + lVar11 * 2) +
             *(double *)
              ((long)&(local_50.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>.
                       _M_impl.super__Vector_impl_data._M_start)->lo + lVar11 * 2);
        lVar11 = lVar11 + 8;
      } while ((long)iVar1 * 8 != lVar11);
    }
    operator_delete(local_50.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl
                    .super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void HighsSparseMatrix::productTransposeQuad(
    vector<double>& result, const vector<double>& row,
    const HighsInt debug_report) const {
  assert(this->formatOk());
  assert((int)row.size() >= this->num_row_);
  result.assign(this->num_col_, 0.0);
  if (this->isColwise()) {
    for (HighsInt iCol = 0; iCol < this->num_col_; iCol++) {
      HighsCDouble value = 0.0;
      for (HighsInt iEl = this->start_[iCol]; iEl < this->start_[iCol + 1];
           iEl++)
        value += row[this->index_[iEl]] * this->value_[iEl];
      result[iCol] = double(value);
    }
  } else {
    std::vector<HighsCDouble> value(this->num_col_, 0);
    for (HighsInt iRow = 0; iRow < this->num_row_; iRow++) {
      for (HighsInt iEl = this->start_[iRow]; iEl < this->start_[iRow + 1];
           iEl++)
        value[this->index_[iEl]] += row[iRow] * this->value_[iEl];
    }
    for (HighsInt iCol = 0; iCol < this->num_col_; iCol++)
      result[iCol] = double(value[iCol]);
  }
}